

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O0

ImageLevel * __thiscall Imf_3_4::Image::level(Image *this,int lx,int ly)

{
  bool bVar1;
  ostream *poVar2;
  ArgExc *this_00;
  ImageLevel **ppIVar3;
  int in_EDX;
  int in_ESI;
  Image *in_RDI;
  stringstream _iex_throw_s;
  undefined8 in_stack_fffffffffffffe48;
  stringstream local_198 [16];
  ostream local_188 [376];
  int local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  bVar1 = levelNumberIsValid(in_RDI,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                             (int)in_stack_fffffffffffffe48);
  if (!bVar1) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_198);
    poVar2 = std::operator<<(local_188,"Cannot access image level with invalid level number (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
    std::operator<<(poVar2,").");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,local_198);
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  ppIVar3 = Array2D<Imf_3_4::ImageLevel_*>::operator[](&in_RDI->_levels,(long)local_10);
  return ppIVar3[local_c];
}

Assistant:

ImageLevel&
Image::level (int lx, int ly)
{
    if (!levelNumberIsValid (lx, ly))
    {
        THROW (
            ArgExc,
            "Cannot access image level with invalid "
            "level number ("
                << lx << ", " << ly << ").");
    }

    return *_levels[ly][lx];
}